

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

void sfts_find_hdukey(sfts_t *f,char *key)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int h;
  bool bVar4;
  char _msg [31];
  
  iVar1 = sfts_get_nhdus(f);
  if (0 < iVar1) {
    h = 1;
    do {
      sfts_goto_hdu(f,h);
      pcVar2 = sfts_read_keystring0(f,key);
      if (pcVar2 != (char *)0x0) {
        g_free(pcVar2);
        break;
      }
      bVar4 = h != iVar1;
      h = h + 1;
    } while (bVar4);
  }
  if ((f != (sfts_t *)0x0) && (f->stat != 0)) {
    if (f->name == (char *)0x0) {
      uVar3 = g_strdup("memory");
    }
    else {
      uVar3 = g_path_get_basename();
    }
    ffgerr(f->stat,_msg);
    _msg[0x1e] = '\0';
    _p2sc_msg("sfts_find_hdukey",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
              ,0x230,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
              _msg,uVar3);
    exit(1);
  }
  return;
}

Assistant:

void sfts_find_hdukey(sfts_t *f, const char *key) {
    int num = sfts_get_nhdus(f);
    for (int i = 1; i <= num; ++i) {
        sfts_goto_hdu(f, i);
        char *val = sfts_read_keystring0(f, key);
        if (val == NULL)
            continue;
        else {
            g_free(val);
            break;
        }
    }
    CHK_FTS(f);
}